

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O1

void P_SpawnScrollers(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  side_t *psVar4;
  side_t *psVar5;
  EScrollPos EVar6;
  line_t_conflict *plVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  FLineSpecial *pFVar11;
  DScroller *pDVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  line_t_conflict *plVar18;
  FSectorTagIterator itr;
  TArray<int,_int> copyscrollers;
  uint local_7c;
  double local_78;
  FLineIdIterator local_70;
  TArray<int,_int> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  plVar18 = lines;
  local_68.Array = (int *)0x0;
  local_68.Most = 0;
  local_68.Count = 0;
  if (0 < numlines) {
    lVar14 = 0x28;
    lVar17 = 0;
    do {
      if (*(int *)((long)lines->args + lVar14 + -0x2c) == 0x3a) {
        bVar8 = FTagManager::SectorHasTag
                          (&tagManager,*(sector_t **)((long)lines->sidedef + lVar14 + 8),
                           *(int *)((long)lines->args + lVar14 + -0x28));
        if (!bVar8) {
          TArray<int,_int>::Grow(&local_68,1);
          local_68.Array[local_68.Count] = (int)lVar17;
          local_68.Count = local_68.Count + 1;
        }
        *(undefined4 *)((long)lines->args + lVar14 + -0x2c) = 0;
      }
      lVar17 = lVar17 + 1;
      lVar14 = lVar14 + 0x98;
    } while (lVar17 < numlines);
  }
  if (0 < numlines) {
    uVar15 = 0;
    do {
      uVar9 = plVar18->special;
      pFVar11 = P_GetLineSpecialInfo(uVar9);
      if ((pFVar11 != (FLineSpecial *)0x0) && (uVar13 = (ulong)pFVar11->map_args, uVar13 < 5)) {
        do {
          if (plVar18->args[uVar13] != 0) {
            Printf("Line %d (type %d:%s), arg %u is %d (should be 0)\n",uVar15 & 0xffffffff,
                   (ulong)uVar9,pFVar11->name,(ulong)((int)uVar13 + 1));
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != 5);
      }
      plVar18->special = 0;
      psVar5 = sides;
      if (uVar9 - 0xde < 3) {
        uVar1 = plVar18->args[1];
        if ((uVar1 & 3) == 0) {
          iVar16 = -1;
          local_7c = 0;
        }
        else {
          iVar16 = (int)((ulong)((long)plVar18->sidedef[0]->sector - (long)sectors) >> 3) *
                   0x7a44c6b;
          local_7c = uVar1 >> 1 & 1;
        }
        if (uVar9 == 0xde || (uVar1 & 4) != 0) {
          local_58 = (plVar18->delta).X;
          local_78 = (plVar18->delta).Y;
        }
        else {
          local_58 = (double)(plVar18->args[3] + -0x80);
          local_78 = (double)(plVar18->args[4] + -0x80);
        }
        local_58 = local_58 * 0.03125;
        local_78 = local_78 * 0.03125;
      }
      else {
        local_78 = 0.0;
        iVar16 = -1;
        local_7c = 0;
        local_58 = 0.0;
      }
      uStack_50 = 0;
      switch(uVar9) {
      case 0xdd:
        if (plVar18->args[0] == 0) {
          uVar13 = (long)lines[uVar15].sidedef[0] - (long)sides;
          iVar16 = plVar18->args[1];
          iVar10 = plVar18->args[2];
          iVar2 = plVar18->args[4];
          iVar3 = plVar18->args[3];
          pDVar12 = (DScroller *)
                    M_Malloc_Dbg(0x90,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          DScroller::DScroller
                    (pDVar12,sc_side,(double)(iVar16 - iVar10) * 0.015625,
                     (double)(iVar2 - iVar3) * 0.015625,-1,(int)(uVar13 >> 6) * -0x55555555,local_7c
                     ,scw_all);
        }
        break;
      case 0xde:
        local_70.searchtag = plVar18->args[0];
        local_70.start = tagManager.IDHashFirst[local_70.searchtag & 0xff];
        while (uVar9 = FLineIdIterator::Next(&local_70), -1 < (int)uVar9) {
          if (uVar15 != uVar9) {
            pDVar12 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            DScroller::DScroller(pDVar12,local_58,local_78,lines + uVar9,iVar16,local_7c,scw_all);
          }
        }
        break;
      case 0xdf:
        if (plVar18->args[2] != 1) {
          local_70.searchtag = plVar18->args[0];
          if (local_70.searchtag == 0) {
            local_70.start = 0;
          }
          else {
            local_70.start = tagManager.TagHashFirst[(byte)local_70.searchtag];
          }
          uStack_44 = local_58._4_4_ ^ 0x80000000;
          uStack_40 = 0;
          uStack_3c = 0x80000000;
          local_48 = (undefined4)local_58;
          while (iVar10 = FSectorTagIterator::Next((FSectorTagIterator *)&local_70), -1 < iVar10) {
            pDVar12 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            DScroller::DScroller
                      (pDVar12,sc_floor,(double)CONCAT44(uStack_44,local_48),local_78,iVar16,iVar10,
                       local_7c,scw_all);
          }
          if (local_68.Count != 0) {
            uVar13 = 0;
            do {
              plVar7 = lines;
              iVar10 = local_68.Array[uVar13];
              if ((lines[iVar10].args[0] == plVar18->args[0]) && ((lines[iVar10].args[1] & 2) != 0))
              {
                pDVar12 = (DScroller *)
                          M_Malloc_Dbg(0x90,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                       ,0x1f9);
                DScroller::DScroller
                          (pDVar12,sc_floor,(double)CONCAT44(uStack_44,local_48),local_78,iVar16,
                           (int)((ulong)((long)plVar7[iVar10].frontsector - (long)sectors) >> 3) *
                           0x7a44c6b,local_7c,scw_all);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < (ulong)local_68._8_8_ >> 0x20);
          }
        }
        if (0 < plVar18->args[2]) {
          local_70.searchtag = plVar18->args[0];
          if (local_70.searchtag == 0) {
            local_70.start = 0;
          }
          else {
            local_70.start = tagManager.TagHashFirst[(byte)local_70.searchtag];
          }
          while (iVar10 = FSectorTagIterator::Next((FSectorTagIterator *)&local_70), -1 < iVar10) {
            pDVar12 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            DScroller::DScroller(pDVar12,sc_carry,local_58,local_78,iVar16,iVar10,local_7c,scw_all);
          }
          if (local_68.Count != 0) {
            uVar13 = 0;
            do {
              plVar7 = lines;
              iVar10 = local_68.Array[uVar13];
              if ((lines[iVar10].args[0] == plVar18->args[0]) && ((lines[iVar10].args[1] & 4) != 0))
              {
                pDVar12 = (DScroller *)
                          M_Malloc_Dbg(0x90,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                       ,0x1f9);
                DScroller::DScroller
                          (pDVar12,sc_carry,local_58,local_78,iVar16,
                           (int)((ulong)((long)plVar7[iVar10].frontsector - (long)sectors) >> 3) *
                           0x7a44c6b,local_7c,scw_all);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < (ulong)local_68._8_8_ >> 0x20);
          }
        }
        break;
      case 0xe0:
        local_70.searchtag = plVar18->args[0];
        if (local_70.searchtag == 0) {
          local_70.start = 0;
        }
        else {
          local_70.start = tagManager.TagHashFirst[(byte)local_70.searchtag];
        }
        local_58 = -local_58;
        uStack_50 = 0x8000000000000000;
        while (iVar10 = FSectorTagIterator::Next((FSectorTagIterator *)&local_70), -1 < iVar10) {
          pDVar12 = (DScroller *)
                    M_Malloc_Dbg(0x90,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          DScroller::DScroller(pDVar12,sc_ceiling,local_58,local_78,iVar16,iVar10,local_7c,scw_all);
        }
        if (local_68.Count != 0) {
          uVar13 = 0;
          do {
            plVar7 = lines;
            iVar10 = local_68.Array[uVar13];
            if ((lines[iVar10].args[0] == plVar18->args[0]) && ((lines[iVar10].args[1] & 1) != 0)) {
              pDVar12 = (DScroller *)
                        M_Malloc_Dbg(0x90,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                     ,0x1f9);
              DScroller::DScroller
                        (pDVar12,sc_ceiling,local_58,local_78,iVar16,
                         (int)((ulong)((long)plVar7[iVar10].frontsector - (long)sectors) >> 3) *
                         0x7a44c6b,local_7c,scw_all);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < (ulong)local_68._8_8_ >> 0x20);
        }
        break;
      case 0xe1:
        psVar4 = lines[uVar15].sidedef[0];
        pDVar12 = (DScroller *)
                  M_Malloc_Dbg(0x90,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                               ,0x1f9);
        iVar16 = (int)((long)psVar4 - (long)psVar5 >> 6) * -0x55555555;
        EVar6 = plVar18->args[0];
        if (6 < plVar18->args[0] - scw_top) {
          EVar6 = scw_all;
        }
        DScroller::DScroller
                  (pDVar12,sc_side,-sides[iVar16].textures[1].xOffset,
                   sides[iVar16].textures[1].yOffset,-1,iVar16,local_7c,EVar6);
        break;
      default:
        switch(uVar9) {
        case 100:
          plVar18->special = 100;
          psVar4 = sides;
          psVar5 = lines[uVar15].sidedef[0];
          pDVar12 = (DScroller *)
                    M_Malloc_Dbg(0x90,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          EVar6 = plVar18->args[1];
          if (6 < plVar18->args[1] - scw_top) {
            EVar6 = scw_all;
          }
          DScroller::DScroller
                    (pDVar12,sc_side,(double)plVar18->args[0] * 0.015625,0.0,-1,
                     (int)((ulong)((long)psVar5 - (long)psVar4) >> 6) * -0x55555555,local_7c,EVar6);
          break;
        case 0x65:
          plVar18->special = 0x65;
          psVar4 = sides;
          psVar5 = lines[uVar15].sidedef[0];
          pDVar12 = (DScroller *)
                    M_Malloc_Dbg(0x90,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          EVar6 = plVar18->args[1];
          if (6 < plVar18->args[1] - scw_top) {
            EVar6 = scw_all;
          }
          DScroller::DScroller
                    (pDVar12,sc_side,(double)-plVar18->args[0] * 0.015625,0.0,-1,
                     (int)((ulong)((long)psVar5 - (long)psVar4) >> 6) * -0x55555555,local_7c,EVar6);
          break;
        case 0x66:
          plVar18->special = 0x66;
          psVar4 = sides;
          psVar5 = lines[uVar15].sidedef[0];
          pDVar12 = (DScroller *)
                    M_Malloc_Dbg(0x90,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          EVar6 = plVar18->args[1];
          if (6 < plVar18->args[1] - scw_top) {
            EVar6 = scw_all;
          }
          DScroller::DScroller
                    (pDVar12,sc_side,0.0,(double)plVar18->args[0] * 0.015625,-1,
                     (int)((ulong)((long)psVar5 - (long)psVar4) >> 6) * -0x55555555,local_7c,EVar6);
          break;
        case 0x67:
          plVar18->special = 0x67;
          psVar4 = sides;
          psVar5 = lines[uVar15].sidedef[0];
          pDVar12 = (DScroller *)
                    M_Malloc_Dbg(0x90,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          EVar6 = plVar18->args[1];
          if (6 < plVar18->args[1] - scw_top) {
            EVar6 = scw_all;
          }
          DScroller::DScroller
                    (pDVar12,sc_side,0.0,(double)-plVar18->args[0] * 0.015625,-1,
                     (int)((ulong)((long)psVar5 - (long)psVar4) >> 6) * -0x55555555,local_7c,EVar6);
          break;
        default:
          plVar18->special = uVar9;
        }
      }
      uVar15 = uVar15 + 1;
      plVar18 = plVar18 + 1;
    } while ((long)uVar15 < (long)numlines);
  }
  TArray<int,_int>::~TArray(&local_68);
  return;
}

Assistant:

void P_SpawnScrollers(void)
{
	int i;
	line_t *l = lines;
	TArray<int> copyscrollers;

	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Sector_CopyScroller)
		{
			// don't allow copying the scroller if the sector has the same tag as it would just duplicate it.
			if (!tagManager.SectorHasTag(lines[i].frontsector, lines[i].args[0]))
			{
				copyscrollers.Push(i);
			}
			lines[i].special = 0;
		}
	}

	for (i = 0; i < numlines; i++, l++)
	{
		double dx;	// direction and speed of scrolling
		double dy;
		int control = -1, accel = 0;		// no control sector or acceleration
		int special = l->special;

		// Check for undefined parameters that are non-zero and output messages for them.
		// We don't report for specials we don't understand.
		FLineSpecial *spec = P_GetLineSpecialInfo(special);
		if (spec != NULL)
		{
			int max = spec->map_args;
			for (unsigned arg = max; arg < countof(l->args); ++arg)
			{
				if (l->args[arg] != 0)
				{
					Printf("Line %d (type %d:%s), arg %u is %d (should be 0)\n",
						i, special, spec->name, arg+1, l->args[arg]);
				}
			}
		}

		// killough 3/7/98: Types 245-249 are same as 250-254 except that the
		// first side's sector's heights cause scrolling when they change, and
		// this linedef controls the direction and speed of the scrolling. The
		// most complicated linedef since donuts, but powerful :)
		//
		// killough 3/15/98: Add acceleration. Types 214-218 are the same but
		// are accelerative.

		// [RH] Assume that it's a scroller and zero the line's special.
		l->special = 0;

		dx = dy = 0;	// Shut up, GCC

		if (special == Scroll_Ceiling ||
			special == Scroll_Floor ||
			special == Scroll_Texture_Model)
		{
			if (l->args[1] & 3)
			{
				// if 1, then displacement
				// if 2, then accelerative (also if 3)
				control = int(l->sidedef[0]->sector - sectors);
				if (l->args[1] & 2)
					accel = 1;
			}
			if (special == Scroll_Texture_Model ||
				l->args[1] & 4)
			{
				// The line housing the special controls the
				// direction and speed of scrolling.
				dx = l->Delta().X / 32.;
				dy = l->Delta().Y / 32.;
			}
			else
			{
				// The speed and direction are parameters to the special.
				dx = (l->args[3] - 128) / 32.;
				dy = (l->args[4] - 128) / 32.;
			}
		}

		switch (special)
		{
			int s;

		case Scroll_Ceiling:
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
			{
				new DScroller(EScroll::sc_ceiling, -dx, dy, control, s, accel);
			}
			for (unsigned j = 0; j < copyscrollers.Size(); j++)
			{
				line_t *line = &lines[copyscrollers[j]];

				if (line->args[0] == l->args[0] && (line->args[1] & 1))
				{
					new DScroller(EScroll::sc_ceiling, -dx, dy, control, int(line->frontsector - sectors), accel);
				}
			}
			break;
		}

		case Scroll_Floor:
			if (l->args[2] != 1)
			{ // scroll the floor texture
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					new DScroller (EScroll::sc_floor, -dx, dy, control, s, accel);
				}
				for(unsigned j = 0;j < copyscrollers.Size(); j++)
				{
					line_t *line = &lines[copyscrollers[j]];

					if (line->args[0] == l->args[0] && (line->args[1] & 2))
					{
						new DScroller (EScroll::sc_floor, -dx, dy, control, int(line->frontsector-sectors), accel);
					}
				}
			}

			if (l->args[2] > 0)
			{ // carry objects on the floor
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					new DScroller (EScroll::sc_carry, dx, dy, control, s, accel);
				}
				for(unsigned j = 0;j < copyscrollers.Size(); j++)
				{
					line_t *line = &lines[copyscrollers[j]];

					if (line->args[0] == l->args[0] && (line->args[1] & 4))
					{
						new DScroller (EScroll::sc_carry, dx, dy, control, int(line->frontsector-sectors), accel);
					}
				}
			}
			break;

		// killough 3/1/98: scroll wall according to linedef
		// (same direction and speed as scrolling floors)
		case Scroll_Texture_Model:
		{
			FLineIdIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
			{
				if (s != i)
					new DScroller(dx, dy, lines + s, control, accel);
			}
			break;
		}

		case Scroll_Texture_Offsets:
			// killough 3/2/98: scroll according to sidedef offsets
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, -sides[s].GetTextureXOffset(side_t::mid),
				sides[s].GetTextureYOffset(side_t::mid), -1, s, accel, SCROLLTYPE(l->args[0]));
			break;

		case Scroll_Texture_Left:
			l->special = special;	// Restore the special, for compat_useblocking's benefit.
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, l->args[0] / 64., 0,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Right:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, -l->args[0] / 64., 0,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Up:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, 0, l->args[0] / 64.,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Down:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, 0, -l->args[0] / 64.,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Both:
			s = int(lines[i].sidedef[0] - sides);
			if (l->args[0] == 0) {
				dx = (l->args[1] - l->args[2]) / 64.;
				dy = (l->args[4] - l->args[3]) / 64.;
				new DScroller (EScroll::sc_side, dx, dy, -1, s, accel);
			}
			break;

		default:
			// [RH] It wasn't a scroller after all, so restore the special.
			l->special = special;
			break;
		}
	}
}